

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O0

ostream * operator<<(ostream *os,Quaternion<int> *obj)

{
  int iVar1;
  ostream *poVar2;
  void *extraout_RDX;
  char *pcVar3;
  Quaternion<int> *obj_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,"(");
  iVar1 = Quaternion<int>::a(obj);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,",");
  iVar1 = Quaternion<int>::b(obj);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  pcVar3 = ",";
  poVar2 = std::operator<<(poVar2,",");
  iVar1 = Quaternion<int>::c(obj,pcVar3,extraout_RDX);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,",");
  iVar1 = Quaternion<int>::d(obj);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,")");
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Quaternion<T>& obj) {
    os << "(" << obj.a() << "," << obj.b() << "," << obj.c() << "," << obj.d() << ")"; 
    return os;
}